

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall pybind11::str::str(str *this,object *o)

{
  bool bVar1;
  PyObject **ppPVar2;
  PyObject *ptr;
  undefined8 uVar3;
  handle *in_RSI;
  object *in_RDI;
  error_already_set *in_stack_00000010;
  object *in_stack_ffffffffffffffa8;
  handle in_stack_ffffffffffffffb0;
  handle local_28;
  PyObject *local_20;
  handle local_18;
  handle *local_10;
  
  local_20 = in_RSI->m_ptr;
  local_10 = in_RSI;
  bVar1 = check_(in_stack_ffffffffffffffb0);
  if (bVar1) {
    local_28 = object::release(in_stack_ffffffffffffffa8);
    ppPVar2 = pybind11::handle::ptr(&local_28);
    ptr = *ppPVar2;
  }
  else {
    pybind11::handle::ptr(local_10);
    ptr = raw_str(in_stack_ffffffffffffffb0.m_ptr);
  }
  pybind11::handle::handle(&local_18,ptr);
  object::object(in_RDI,local_18.m_ptr);
  if ((in_RDI->super_handle).m_ptr == (PyObject *)0x0) {
    uVar3 = __cxa_allocate_exception(0x28);
    error_already_set::error_already_set(in_stack_00000010);
    __cxa_throw(uVar3,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  return;
}

Assistant:

str(const char *c, size_t n)
        : object(PyUnicode_FromStringAndSize(c, (ssize_t) n), stolen_t{}) {
        if (!m_ptr) pybind11_fail("Could not allocate string object!");
    }